

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  NamedPortConnectionSyntax *pNVar2;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000010;
  BumpAllocator *in_stack_00000018;
  Token *in_stack_00000030;
  BumpAllocator *in_stack_00000038;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000040;
  BumpAllocator *in_stack_000000d8;
  Token *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  PropertyExprSyntax *in_stack_ffffffffffffff90;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000040,in_stack_00000038);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  lVar1._0_2_ = ((Token *)((long)__fn + 0x80))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x80))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x80))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x80))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::PropertyExprSyntax>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  pNVar2 = BumpAllocator::
           emplace<slang::syntax::NamedPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertyExprSyntax*,slang::parsing::Token>
                     (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (Token *)__fn,(PropertyExprSyntax **)__child_stack,in_stack_00000030);
  return (int)pNVar2;
}

Assistant:

static SyntaxNode* clone(const NamedPortConnectionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NamedPortConnectionSyntax>(
        *deepClone(node.attributes, alloc),
        node.dot.deepClone(alloc),
        node.name.deepClone(alloc),
        node.openParen.deepClone(alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}